

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_view_suite.cpp
# Opt level: O3

void dynamic_api_suite::run(void)

{
  undefined8 local_38;
  undefined4 local_2c;
  
  api_ctor_default();
  api_ctor_move();
  api_ctor_array();
  api_ctor_iterator();
  if (boost::detail::test_results()::instance == '\0') {
    run();
  }
  if (boost::detail::test_results()::instance == '\0') {
    run();
  }
  local_38 = 0;
  local_2c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x48,"void dynamic_api_suite::api_size()",&local_38,&local_2c);
  local_38 = 0;
  local_2c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x4e,"void dynamic_api_suite::api_capacity()",&local_38,&local_2c);
  api_clear();
  api_insert_value();
  api_remove_iterator();
  api_lower_bound();
  api_begin_end();
  api_begin_end_const();
  api_cbegin_cend();
  api_key_comp();
  return;
}

Assistant:

void run()
{
    api_ctor_default();
    api_ctor_move();
    api_ctor_array();
    api_ctor_iterator();
    api_empty();
    api_full();
    api_size();
    api_capacity();
    api_clear();
    api_insert_value();
    api_remove_iterator();
    api_lower_bound();
    api_begin_end();
    api_begin_end_const();
    api_cbegin_cend();
    api_key_comp();
}